

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_raw.c
# Opt level: O0

int archive_write_raw_header(archive_write *a,archive_entry *entry)

{
  int *piVar1;
  mode_t mVar2;
  archive_entry *in_RSI;
  archive *in_RDI;
  raw *raw;
  int local_4;
  
  piVar1 = *(int **)&in_RDI[1].current_codepage;
  mVar2 = archive_entry_filetype(in_RSI);
  if (mVar2 == 0x8000) {
    if (*piVar1 < 1) {
      *piVar1 = *piVar1 + 1;
      local_4 = 0;
    }
    else {
      archive_set_error(in_RDI,0x22,"Raw format only supports one entry per archive");
      local_4 = -0x1e;
    }
  }
  else {
    archive_set_error(in_RDI,0x22,"Raw format only supports filetype AE_IFREG");
    local_4 = -0x1e;
  }
  return local_4;
}

Assistant:

static int
archive_write_raw_header(struct archive_write *a, struct archive_entry *entry)
{
	struct raw *raw = (struct raw *)a->format_data;

	if (archive_entry_filetype(entry) != AE_IFREG) {
		archive_set_error(&a->archive, ERANGE,
		    "Raw format only supports filetype AE_IFREG");
		return (ARCHIVE_FATAL);
	}


	if (raw->entries_written > 0) {
		archive_set_error(&a->archive, ERANGE,
		    "Raw format only supports one entry per archive");
		return (ARCHIVE_FATAL);
	}
	raw->entries_written++;

	return (ARCHIVE_OK);
}